

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store_array_elt(XMLWriter *this,Vec3ff *v)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<(&this->field_0x10,(v->field_0).m128[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(v->field_0).m128[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(v->field_0).m128[2]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(v->field_0).m128[3]);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void XMLWriter::store_array_elt(const Vec3ff& v) {
    xml << v.x << " " << v.y << " " << v.z << " " << v.w << std::endl;
  }